

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginTest.cpp
# Opt level: O0

void __thiscall
TEST_PluginTest_DisablesPluginsDontRun_Test::TEST_PluginTest_DisablesPluginsDontRun_Test
          (TEST_PluginTest_DisablesPluginsDontRun_Test *this)

{
  TEST_PluginTest_DisablesPluginsDontRun_Test *this_local;
  
  memset(this,0,0x30);
  TEST_GROUP_CppUTestGroupPluginTest::TEST_GROUP_CppUTestGroupPluginTest
            (&this->super_TEST_GROUP_CppUTestGroupPluginTest);
  (this->super_TEST_GROUP_CppUTestGroupPluginTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_PluginTest_DisablesPluginsDontRun_Test_003d7698;
  return;
}

Assistant:

TEST(PluginTest, DisablesPluginsDontRun)
{
    registry->installPlugin(thirdPlugin);
    thirdPlugin->disable();
    genFixture->runAllTests();
    CHECK(!thirdPlugin->isEnabled());
    thirdPlugin->enable();
    genFixture->runAllTests();
    CHECK_EQUAL(2, firstPlugin->preAction);
    CHECK_EQUAL(1, thirdPlugin->preAction);
    CHECK(thirdPlugin->isEnabled());
}